

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_replace_plugin(_func_void *oldplugin,_func_void *newplugin)

{
  char local_21;
  ulong uStack_20;
  char flag;
  size_t i;
  _func_void *newplugin_local;
  _func_void *oldplugin_local;
  
  local_21 = '\0';
  for (uStack_20 = 0; uStack_20 < (fsnav->core).plugin_count; uStack_20 = uStack_20 + 1) {
    if ((fsnav->core).plugins[uStack_20].func == oldplugin) {
      (fsnav->core).plugins[uStack_20].func = newplugin;
      local_21 = '\x01';
    }
  }
  return local_21;
}

Assistant:

char fsnav_replace_plugin(void(*oldplugin)(void), void(*newplugin)(void))
{
	size_t i;
	char flag;

	for (i = 0, flag = 0; i < fsnav->core.plugin_count; i++) {
		if (fsnav->core.plugins[i].func != oldplugin)
			continue;
		fsnav->core.plugins[i].func = newplugin;
		flag = 1;
	}

	return flag;
}